

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_json.c
# Opt level: O1

char * uo_json_find_end(char *json)

{
  byte bVar1;
  char cVar2;
  ushort *puVar3;
  bool bVar4;
  ushort **ppuVar5;
  char *pcVar6;
  __int32_t **pp_Var7;
  char *unaff_RBX;
  char *pcVar8;
  char *pcVar9;
  
  ppuVar5 = __ctype_b_loc();
  puVar3 = *ppuVar5;
  pcVar9 = json + -2;
  do {
    pcVar8 = pcVar9;
    bVar1 = pcVar8[2];
    pcVar9 = pcVar8 + 1;
  } while ((*(byte *)((long)puVar3 + (long)(char)bVar1 * 2 + 1) & 0x20) != 0);
  if (bVar1 < 0x66) {
    if (bVar1 != 0) {
      if (bVar1 == 0x22) {
        pcVar9 = uo_json_find_str_end(pcVar8 + 2);
        return pcVar9;
      }
      if (bVar1 != 0x5b) goto LAB_001017b1;
      pcVar8 = pcVar8 + 3;
      pcVar9 = strchr(pcVar8,0x5d);
      if (pcVar9 != (char *)0x0) {
        if (pcVar8 == pcVar9) {
          return pcVar9 + 1;
        }
        do {
          if (*pcVar8 == '\0') {
            return (char *)0x0;
          }
          pcVar8 = pcVar8 + -1;
          do {
            pcVar9 = pcVar8 + 1;
            pcVar8 = pcVar8 + 1;
          } while ((*(byte *)((long)puVar3 + (long)*pcVar9 * 2 + 1) & 0x20) != 0);
          pcVar9 = uo_json_find_end(pcVar8);
          if (pcVar9 == (char *)0x0) {
            return (char *)0x0;
          }
          pcVar6 = strchr(pcVar9 + 1,0x5d);
          if (pcVar6 == (char *)0x0) {
            return (char *)0x0;
          }
          pcVar8 = strchr(pcVar9,0x2c);
        } while (pcVar8 != (char *)0x0);
        return pcVar6 + 1;
      }
    }
LAB_00101840:
    pcVar8 = (char *)0x0;
  }
  else {
    if (bVar1 < 0x74) {
      if (bVar1 == 0x66) {
        return pcVar8 + 7;
      }
      if (bVar1 == 0x6e) {
LAB_001017ab:
        return pcVar8 + 6;
      }
    }
    else {
      if (bVar1 == 0x74) goto LAB_001017ab;
      if (bVar1 == 0x7b) {
        pcVar8 = pcVar8 + 3;
        while (*pcVar8 != '\0') {
          pcVar9 = strchr(pcVar8,0x7d);
          if (pcVar9 == (char *)0x0) {
LAB_00101788:
            bVar4 = false;
            unaff_RBX = (char *)0x0;
          }
          else {
            pcVar6 = strchr(pcVar8,0x22);
            if (pcVar6 != (char *)0x0 && pcVar6 <= pcVar9) {
              pcVar9 = uo_json_find_str_end(pcVar6);
              if (pcVar9 != (char *)0x0) {
                pcVar9 = strchr(pcVar9,0x3a);
                if (pcVar9 != (char *)0x0) {
                  do {
                    pcVar8 = pcVar9 + 1;
                    pcVar9 = pcVar9 + 1;
                  } while ((*(byte *)((long)puVar3 + (long)*pcVar8 * 2 + 1) & 0x20) != 0);
                  pcVar8 = uo_json_find_end(pcVar9);
                  if (pcVar8 != (char *)0x0) {
                    pcVar9 = strchr(pcVar8 + 1,0x7d);
                    if (pcVar9 != (char *)0x0) {
                      pcVar8 = strchr(pcVar8,0x2c);
                      if (pcVar8 == (char *)0x0) {
                        pcVar8 = (char *)0x0;
                        goto LAB_00101711;
                      }
                      bVar4 = true;
                      goto LAB_0010178a;
                    }
                    goto LAB_00101788;
                  }
                }
                pcVar8 = (char *)0x0;
              }
              goto LAB_00101788;
            }
LAB_00101711:
            bVar4 = false;
            unaff_RBX = pcVar9 + 1;
          }
LAB_0010178a:
          if (!bVar4) {
            return unaff_RBX;
          }
        }
        goto LAB_00101840;
      }
    }
LAB_001017b1:
    pcVar8 = pcVar9 + (bVar1 == 0x2d);
    pcVar9 = pcVar9 + (ulong)(bVar1 == 0x2d) + 1;
    do {
      cVar2 = *pcVar9;
      pcVar9 = pcVar9 + 1;
      pcVar8 = pcVar8 + 1;
    } while ((*(byte *)((long)puVar3 + (long)cVar2 * 2 + 1) & 8) != 0);
    if ((cVar2 != '.') && (pcVar9 = pcVar8, cVar2 == '\0')) {
      return pcVar8;
    }
    do {
      pcVar8 = pcVar9;
      cVar2 = *pcVar8;
      pcVar9 = pcVar8 + 1;
    } while ((*(byte *)((long)puVar3 + (long)cVar2 * 2 + 1) & 8) != 0);
    pp_Var7 = __ctype_tolower_loc();
    if ((*pp_Var7)[cVar2] == 0x65) {
      if ((*pcVar9 != '-') && (*pcVar9 != '+')) goto LAB_00101840;
      do {
        pcVar6 = pcVar9 + 1;
        pcVar9 = pcVar9 + 1;
        pcVar8 = pcVar9;
      } while ((*(byte *)((long)puVar3 + (long)*pcVar6 * 2 + 1) & 8) != 0);
    }
    cVar2 = *pcVar8;
    if (((cVar2 != '\0') && (cVar2 != ',')) &&
       ((*(byte *)((long)puVar3 + (long)cVar2 * 2 + 1) & 0x20) == 0)) {
      pcVar8 = (char *)0x0;
    }
  }
  return pcVar8;
}

Assistant:

char *uo_json_find_end(
    const char *json)
{
    while (isspace(*json))
        ++json;

    switch (*json)
    {
        case '\0': return NULL;
        case '{':  return uo_json_find_obj_end(json);
        case '[':  return uo_json_find_arr_end(json);
        case '"':  return uo_json_find_str_end(json);
        case 'n':  return (char *)json + UO_STRLEN("null");
        case 't':  return (char *)json + UO_STRLEN("true");
        case 'f':  return (char *)json + UO_STRLEN("false");
        default:   return uo_json_find_num_end(json);
    }
}